

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

APInt __thiscall llvm::detail::DoubleAPFloat::bitcastToAPInt(DoubleAPFloat *this)

{
  uint64_t *puVar1;
  undefined8 extraout_RDX;
  long *in_RSI;
  APInt AVar2;
  undefined1 local_48 [16];
  undefined1 local_38 [24];
  uint64_t Data [2];
  DoubleAPFloat *this_local;
  
  if ((undefined1 *)*in_RSI != semPPCDoubleDouble) {
    __assert_fail("Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x10b2,"APInt llvm::detail::DoubleAPFloat::bitcastToAPInt() const");
  }
  std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
            ((unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_> *)(in_RSI + 1),0);
  APFloat::bitcastToAPInt((APFloat *)local_38);
  puVar1 = APInt::getRawData((APInt *)local_38);
  local_38._16_8_ = *puVar1;
  std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
            ((unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_> *)(in_RSI + 1),1);
  APFloat::bitcastToAPInt((APFloat *)local_48);
  puVar1 = APInt::getRawData((APInt *)local_48);
  Data[0] = *puVar1;
  APInt::~APInt((APInt *)local_48);
  APInt::~APInt((APInt *)local_38);
  APInt::APInt((APInt *)this,0x80,2,(uint64_t *)(local_38 + 0x10));
  AVar2._8_8_ = extraout_RDX;
  AVar2.U.pVal = (uint64_t *)this;
  return AVar2;
}

Assistant:

APInt DoubleAPFloat::bitcastToAPInt() const {
  assert(Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  uint64_t Data[] = {
      Floats[0].bitcastToAPInt().getRawData()[0],
      Floats[1].bitcastToAPInt().getRawData()[0],
  };
  return APInt(128, 2, Data);
}